

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

Pseudo * linearize_function_call_expression
                   (Proc *proc,AstNode *expr,AstNode *callsite_expr,Pseudo *callsite_pseudo)

{
  ravitype_t rVar1;
  uint uVar2;
  StringObject *s;
  AstNodeList *head;
  C_MemoryAllocator *pCVar3;
  void *pvVar4;
  _func_void_ptr_void_ptr_size_t_size_t *p_Var5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  opcode op;
  undefined8 pseudo;
  int iVar9;
  Instruction *insn;
  Constant *pCVar10;
  Pseudo *pPVar11;
  Instruction *insn_00;
  Pseudo *pPVar12;
  AstNode *expr_00;
  long lVar13;
  int i;
  long lVar14;
  code *apcStack_80 [2];
  undefined1 local_70 [8];
  PtrListIterator argiter__;
  Pseudo *local_48;
  
  apcStack_80[0] = (code *)0x1188a3;
  insn = allocate_instruction(proc,op_call,expr->line_number);
  s = (expr->field_2).function_call_expr.method_name;
  if (s == (StringObject *)0x0) {
    pPVar11 = (Pseudo *)0x0;
  }
  else {
    apcStack_80[0] = (code *)0x1188bc;
    pCVar10 = allocate_string_constant(proc,s);
    apcStack_80[0] = (code *)0x1188c7;
    pPVar11 = allocate_constant_pseudo(proc,pCVar10);
    rVar1 = (callsite_expr->field_2).common_expr.type.type_code;
    if (rVar1 == RAVI_TTABLE) {
      op = op_tget_skey;
    }
    else {
      if ((rVar1 == RAVI_TARRAYINT) || (rVar1 == RAVI_TARRAYFLT)) {
        apcStack_80[0] = allocate_indexed_pseudo;
        __assert_fail("container_type != RAVI_TARRAYINT && container_type != RAVI_TARRAYFLT",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x5d8,
                      "Pseudo *instruct_indexed_load(Proc *, ravitype_t, Pseudo *, ravitype_t, Pseudo *, ravitype_t, unsigned int)"
                     );
      }
      op = op_get_skey;
    }
    apcStack_80[0] = (code *)0x118907;
    insn_00 = allocate_instruction(proc,op,expr->line_number);
    apcStack_80[0] = (code *)0x118919;
    pPVar12 = add_instruction_operand(proc,insn_00,callsite_pseudo);
    apcStack_80[0] = (code *)0x11892a;
    pPVar11 = add_instruction_operand(proc,insn_00,pPVar11);
    if (pPVar12 != (Pseudo *)0x0) {
      apcStack_80[0] = (code *)0x11893f;
      free_temp_pseudo(proc,pPVar12,false);
    }
    if (pPVar11 != (Pseudo *)0x0) {
      apcStack_80[0] = (code *)0x118951;
      free_temp_pseudo(proc,pPVar11,false);
    }
    apcStack_80[0] = (code *)0x11895f;
    pPVar12 = allocate_temp_pseudo(proc,RAVI_TANY,true);
    apcStack_80[0] = (code *)0x118970;
    add_instruction_target(proc,insn_00,pPVar12);
    apcStack_80[0] = (code *)0x11897b;
    add_instruction(proc,insn_00);
    pPVar11 = callsite_pseudo;
    callsite_pseudo = pPVar12;
  }
  if (((undefined1  [48])*callsite_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0x4) {
    apcStack_80[0] = (code *)0x11899d;
    check_pseudo_is_top(proc,callsite_pseudo);
    pPVar12 = callsite_pseudo;
  }
  else {
    apcStack_80[0] = (code *)0x1189b0;
    pPVar12 = allocate_temp_pseudo(proc,RAVI_TANY,true);
    apcStack_80[0] = (code *)0x1189cd;
    instruct_move(proc,op_mov,pPVar12,callsite_pseudo,expr->line_number);
  }
  apcStack_80[0] = (code *)0x1189df;
  argiter__._16_8_ = add_instruction_operand(proc,insn,pPVar12);
  if (pPVar11 == (Pseudo *)0x0) {
    local_48 = (Pseudo *)0x0;
  }
  else {
    apcStack_80[0] = (code *)0x1189f6;
    local_48 = add_instruction_operand(proc,insn,pPVar11);
  }
  apcStack_80[0] = (code *)0x118a0e;
  iVar9 = raviX_ptrlist_size((PtrList *)(expr->field_2).for_stmt.for_statement_list);
  lVar8 = -((long)iVar9 * 8 + 0xfU & 0xfffffffffffffff0);
  head = (expr->field_2).for_stmt.for_statement_list;
  *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118a39;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_70,(PtrList *)head);
  *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118a41;
  expr_00 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_70);
  lVar13 = 0;
  while (expr_00 != (AstNode *)0x0) {
    *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118a57;
    pPVar11 = linearize_expression(proc,expr_00);
    if ((iVar9 + -1 != (int)lVar13) &&
       (((undefined1  [48])*pPVar11 & (undefined1  [48])0xf) == (undefined1  [48])0xb)) {
      *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118a72;
      convert_range_to_temp(pPVar11);
    }
    *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118a81;
    pPVar11 = add_instruction_operand(proc,insn,pPVar11);
    *(Pseudo **)((long)apcStack_80 + lVar13 * 8 + lVar8 + -0x78 + 0x80) = pPVar11;
    lVar13 = lVar13 + 1;
    *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118a91;
    expr_00 = (AstNode *)raviX_ptrlist_iter_next((PtrListIterator *)local_70);
  }
  pCVar3 = proc->linearizer->compiler_state->allocator;
  pvVar4 = pCVar3->arena;
  *(undefined8 *)((long)apcStack_80 + lVar8) = 1;
  sVar6 = *(size_t *)((long)apcStack_80 + lVar8);
  *(undefined8 *)((long)apcStack_80 + lVar8) = 0x30;
  sVar7 = *(size_t *)((long)apcStack_80 + lVar8);
  p_Var5 = pCVar3->calloc;
  *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118aa9;
  pPVar11 = (Pseudo *)(*p_Var5)(pvVar4,sVar6,sVar7);
  uVar2 = *(uint *)pPVar11;
  *(uint *)pPVar11 = uVar2 & 0xfffffff0 | 0xb;
  *(uint *)pPVar11 = uVar2 & 0xfff00000 | 0xb | *(uint *)pPVar12 & 0xffff0;
  if ((*(uint *)pPVar12 & 0xf) == 4) {
    *(uint *)pPVar12 = *(uint *)pPVar12 | 0x100000;
  }
  *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118af3;
  add_instruction_target(proc,insn,pPVar11);
  iVar9 = (expr->field_2).function_call_expr.num_results;
  *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118b02;
  pCVar10 = allocate_integer_constant(proc,iVar9);
  *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118b0d;
  pPVar12 = allocate_constant_pseudo(proc,pCVar10);
  *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118b1b;
  add_instruction_target(proc,insn,pPVar12);
  *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118b26;
  add_instruction(proc,insn);
  *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118b31;
  free_instruction_operand_pseudos(proc,insn);
  pseudo = argiter__._16_8_;
  if (argiter__._16_8_ != 0) {
    *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118b44;
    free_temp_pseudo(proc,(Pseudo *)pseudo,false);
  }
  if (local_48 != (Pseudo *)0x0) {
    *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118b57;
    free_temp_pseudo(proc,local_48,false);
  }
  for (lVar14 = 0; lVar13 != lVar14; lVar14 = lVar14 + 1) {
    pPVar12 = *(Pseudo **)((long)apcStack_80 + lVar14 * 8 + lVar8 + -0x78 + 0x80);
    if (pPVar12 != (Pseudo *)0x0) {
      *(undefined8 *)((long)apcStack_80 + lVar8) = 0x118b72;
      free_temp_pseudo(proc,pPVar12,false);
    }
  }
  return pPVar11;
}

Assistant:

static Pseudo *linearize_function_call_expression(Proc *proc, AstNode *expr,
							 AstNode *callsite_expr, Pseudo *callsite_pseudo)
{
	Instruction *insn = allocate_instruction(proc, op_call, expr->line_number);

	Pseudo *self_arg = NULL; /* For method call */
	if (expr->function_call_expr.method_name) {
		const Constant *name_constant =
		    allocate_string_constant(proc, expr->function_call_expr.method_name);
		Pseudo *name_pseudo = allocate_constant_pseudo(proc, name_constant);
		self_arg = callsite_pseudo; /* The original callsite must be passed as 'self' */
		/* create new call site as callsite[name] */
		callsite_pseudo = instruct_indexed_load(proc, callsite_expr->common_expr.type.type_code,
							callsite_pseudo, RAVI_TSTRING, name_pseudo, RAVI_TANY, expr->line_number);
	}

	// callsite needs to be at the top of the stack and also must be a temp
	if (callsite_pseudo->type != PSEUDO_TEMP_ANY) {
		Pseudo *temp = allocate_temp_pseudo(proc, RAVI_TANY, true);
		instruct_move(proc, op_mov, temp, callsite_pseudo, expr->line_number);
		callsite_pseudo = temp;
	}
	else {
		// assert that the pseudo is at the top
		check_pseudo_is_top(proc, callsite_pseudo);
	}

	Pseudo *tofree1 = add_instruction_operand(proc, insn, callsite_pseudo);
	Pseudo *tofree2 = NULL;
	if (self_arg) {
		tofree2 = add_instruction_operand(proc, insn, self_arg);
	}

	// add the args
	AstNode *arg;
	int argc = raviX_ptrlist_size((const PtrList *)expr->function_call_expr.arg_list);
	Pseudo **tofreelist = (Pseudo **) alloca(argc * sizeof(Pseudo *));
	int argi = 0;
	FOR_EACH_PTR(expr->function_call_expr.arg_list, AstNode, arg)
	{
		argc -= 1;
		Pseudo *arg_pseudo = linearize_expression(proc, arg);
		if (argc != 0 && arg_pseudo->type == PSEUDO_RANGE) {
			// Not last one, so range can only be 1
			convert_range_to_temp(arg_pseudo);
		}
		tofreelist[argi++] = add_instruction_operand(proc, insn, arg_pseudo);
	}
	END_FOR_EACH_PTR(arg)

	Pseudo *return_pseudo = allocate_range_pseudo(
	    proc, callsite_pseudo); /* Base reg for function call - where return values will be placed */
	add_instruction_target(proc, insn, return_pseudo);
	add_instruction_target(proc, insn, allocate_constant_pseudo(proc, allocate_integer_constant(proc, expr->function_call_expr.num_results)));
	add_instruction(proc, insn);

	free_instruction_operand_pseudos(proc, insn);
	if (tofree1)
		free_temp_pseudo(proc, tofree1, false);
	if (tofree2)
		free_temp_pseudo(proc, tofree2, false);
	for (int i = 0; i < argi; i++) {
		Pseudo *tofree = tofreelist[i];
		if (tofree)
			free_temp_pseudo(proc, tofree, false);
	}
	return return_pseudo;
}